

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_4dRect::IntersectRect(ON_4dRect *this,ON_4dRect *r1,ON_4dRect *r2)

{
  double dVar1;
  ON_4dRect *r2_local;
  ON_4dRect *r1_local;
  ON_4dRect *this_local;
  
  dVar1 = ON_Max(r1->left,r2->left);
  this->left = dVar1;
  dVar1 = ON_Min(r1->right,r2->right);
  this->right = dVar1;
  if (this->left <= this->right && this->right != this->left) {
    dVar1 = ON_Max(r1->top,r2->top);
    this->top = dVar1;
    dVar1 = ON_Min(r1->bottom,r2->bottom);
    this->bottom = dVar1;
    if (this->top <= this->bottom && this->bottom != this->top) {
      return true;
    }
  }
  SetRectEmpty(this);
  return false;
}

Assistant:

bool ON_4dRect::IntersectRect(const ON_4dRect * r1, const ON_4dRect * r2)
{
  // The previous implementation was incorrect. The implementation for ON_4iRect::Intersect
  // was/is correct, so its implemenation is now used here.
  left = ON_Max(r1->left, r2->left);
  right = ON_Min(r1->right, r2->right);
  if (right > left)
  {
    top = ON_Max(r1->top, r2->top);
    bottom = ON_Min(r1->bottom, r2->bottom);
    if (bottom > top)
      return true;
  }

  // degenerate rectangle at this point...
  SetRectEmpty();
  return false;
}